

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O0

Pattern * __thiscall CombinePattern::simplifyClone(CombinePattern *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CombinePattern *this_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  CombinePattern *this_local;
  
  uVar1 = (*(this->context->super_DisjointPattern).super_Pattern._vptr_Pattern[10])();
  if ((uVar1 & 1) == 0) {
    uVar1 = (*(this->instr->super_DisjointPattern).super_Pattern._vptr_Pattern[10])();
    if ((uVar1 & 1) == 0) {
      uVar1 = (*(this->context->super_DisjointPattern).super_Pattern._vptr_Pattern[0xb])();
      if (((uVar1 & 1) == 0) &&
         (uVar1 = (*(this->instr->super_DisjointPattern).super_Pattern._vptr_Pattern[0xb])(),
         (uVar1 & 1) == 0)) {
        this_00 = (CombinePattern *)operator_new(0x18);
        iVar2 = (*(this->context->super_DisjointPattern).super_Pattern._vptr_Pattern[2])();
        iVar3 = (*(this->instr->super_DisjointPattern).super_Pattern._vptr_Pattern[2])();
        CombinePattern(this_00,(ContextPattern *)CONCAT44(extraout_var_01,iVar2),
                       (InstructionPattern *)CONCAT44(extraout_var_02,iVar3));
        return (Pattern *)this_00;
      }
      this_local = (CombinePattern *)operator_new(0x10);
      InstructionPattern::InstructionPattern((InstructionPattern *)this_local,false);
    }
    else {
      iVar2 = (*(this->context->super_DisjointPattern).super_Pattern._vptr_Pattern[2])();
      this_local = (CombinePattern *)CONCAT44(extraout_var_00,iVar2);
    }
  }
  else {
    iVar2 = (*(this->instr->super_DisjointPattern).super_Pattern._vptr_Pattern[2])();
    this_local = (CombinePattern *)CONCAT44(extraout_var,iVar2);
  }
  return (Pattern *)this_local;
}

Assistant:

Pattern *CombinePattern::simplifyClone(void) const

{				// We should only have to think at "our" level
  if (context->alwaysTrue())
    return instr->simplifyClone();
  if (instr->alwaysTrue())
    return context->simplifyClone();
  if (context->alwaysFalse()||instr->alwaysFalse())
    return new InstructionPattern(false);
  return new CombinePattern((ContextPattern *)context->simplifyClone(),
			    (InstructionPattern *)instr->simplifyClone());
}